

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_head.c
# Opt level: O3

void print_title(FILE *out,int hdunum,int hdutype)

{
  ulong uVar1;
  char *__format;
  
  curhdu = hdunum;
  if (print_title::oldhdu != hdunum) {
    uVar1 = (ulong)(uint)hdunum;
    if (hdunum == 1) {
      __format = " HDU %d: Primary Array ";
      uVar1 = 1;
    }
    else if (hdutype == 2) {
      __format = " HDU %d: BINARY Table ";
    }
    else if (hdutype == 1) {
      __format = " HDU %d: ASCII Table ";
    }
    else if (hdutype == 0) {
      __format = " HDU %d: Image Exten. ";
    }
    else {
      __format = " HDU %d: Unknown Ext. ";
    }
    sprintf(print_title::hdutitle,__format,uVar1);
    wrtsep(out,'=',print_title::hdutitle,0x3c);
    wrtout(out," ");
    print_title::oldhdu = 0;
    if (curhdu != totalhdu) {
      print_title::oldhdu = curhdu;
    }
  }
  return;
}

Assistant:

void print_title(FILE* out, int hdunum, int hdutype)
{
    static char hdutitle[64];
    static int oldhdu = 0;

    /* print out the title */
    curhdu = hdunum;
    curtype = hdutype;

    if(oldhdu == curhdu) return; /* Do not print it twice */
    if(curhdu == 1){
	        sprintf(hdutitle," HDU %d: Primary Array ", curhdu);
    }
    else { 
        switch (curtype) { 
	    case IMAGE_HDU:  
		sprintf(hdutitle," HDU %d: Image Exten. ", curhdu);
                break;
	    case ASCII_TBL:  
		sprintf(hdutitle," HDU %d: ASCII Table ", curhdu);
                break;
	    case BINARY_TBL:  
		sprintf(hdutitle," HDU %d: BINARY Table ", curhdu);
                break;
            default: 
		sprintf(hdutitle," HDU %d: Unknown Ext. ", curhdu);
                break;
        }
    } 
    wrtsep(out,'=',hdutitle,60);
    wrtout(out," ");
    oldhdu = curhdu;
    if(curhdu == totalhdu) oldhdu = 0;  /* reset the old hdu at the last hdu */
    return; 
}